

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void ArraySortEx(array *p,size_t Count,size_t Width,arraycmp Cmp,void *CmpParam,bool_t Unique)

{
  int iVar1;
  size_t sVar2;
  uint_fast32_t uVar3;
  bool bVar4;
  uint_fast32_t local_58;
  uint_fast32_t Tmp;
  uint_fast32_t *j;
  uint_fast32_t *i;
  uint_fast32_t *End;
  bool_t Unique_local;
  void *CmpParam_local;
  arraycmp Cmp_local;
  size_t Width_local;
  size_t Count_local;
  array *p_local;
  
  End = (uint_fast32_t *)Unique;
  Unique_local = (bool_t)CmpParam;
  CmpParam_local = Cmp;
  Cmp_local = (arraycmp)Width;
  Width_local = Count;
  Count_local = (size_t)p;
  if (Count == 0xffffffffffffffff) {
    sVar2 = ArraySize(p);
    Width_local = sVar2 / (ulong)Cmp_local;
  }
  if (1 < Width_local) {
    if (Cmp_local == (arraycmp)0x8) {
      if (Count_local == 0) {
        __assert_fail("&(*p)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                      ,0x194,
                      "void ArraySortEx(array *, size_t, size_t, arraycmp, const void *, bool_t)");
      }
      i = (uint_fast32_t *)(*(long *)Count_local + Width_local * 8);
      if (Count_local == 0) {
        __assert_fail("&(*p)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                      ,0x198,
                      "void ArraySortEx(array *, size_t, size_t, arraycmp, const void *, bool_t)");
      }
      InQSort(*(uint_fast32_t **)Count_local,i + -1,(arraycmp)CmpParam_local,(void *)Unique_local);
      if (Count_local == 0) {
        __assert_fail("&(*p)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                      ,0x19a,
                      "void ArraySortEx(array *, size_t, size_t, arraycmp, const void *, bool_t)");
      }
      Tmp = *(uint_fast32_t *)Count_local;
      while (j = (uint_fast32_t *)(Tmp + 8), j != i) {
        iVar1 = (*(code *)CmpParam_local)(Unique_local,j,Tmp);
        if (iVar1 < 0) {
          local_58 = *j;
          do {
            *(undefined8 *)(Tmp + 8) = *(undefined8 *)Tmp;
            uVar3 = Tmp - 8;
            if (Count_local == 0) {
              Tmp = uVar3;
              __assert_fail("&(*p)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                            ,0x1a3,
                            "void ArraySortEx(array *, size_t, size_t, arraycmp, const void *, bool_t)"
                           );
            }
            bVar4 = Tmp != *(uint_fast32_t *)Count_local;
            Tmp = uVar3;
          } while ((bVar4) &&
                  (iVar1 = (*(code *)CmpParam_local)(Unique_local,&local_58,uVar3), iVar1 < 0));
          *(uint_fast32_t *)(Tmp + 8) = local_58;
        }
        Tmp = (uint_fast32_t)j;
      }
      if (End != (uint_fast32_t *)0x0) {
        if (Count_local == 0) {
          __assert_fail("&(*p)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                        ,0x1ae,
                        "void ArraySortEx(array *, size_t, size_t, arraycmp, const void *, bool_t)")
          ;
        }
        j = *(uint_fast32_t **)Count_local;
        Tmp = (uint_fast32_t)j;
        while (j = j + 1, j != i) {
          iVar1 = (*(code *)CmpParam_local)(Unique_local,j,Tmp);
          if (iVar1 != 0) {
            *(uint_fast32_t *)(Tmp + 8) = *j;
            Tmp = Tmp + 8;
          }
        }
        if (Count_local == 0) {
          __assert_fail("&(*p)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                        ,0x1b4,
                        "void ArraySortEx(array *, size_t, size_t, arraycmp, const void *, bool_t)")
          ;
        }
        *(long *)(Count_local + 8) = ((long)((Tmp + 8) - *(long *)Count_local) >> 3) << 3;
      }
    }
    else {
      SlowSort((array *)Count_local,Width_local,(size_t)Cmp_local,(arraycmp)CmpParam_local,
               (void *)Unique_local,(bool_t)End);
    }
  }
  return;
}

Assistant:

void ArraySortEx(array* p, size_t Count, size_t Width, arraycmp Cmp, const void* CmpParam, bool_t Unique)
{
    if (Count == ARRAY_AUTO_COUNT)
        Count = ArraySize(p)/Width;

    if (Count<=1)
        return;

    if (Width == sizeof(uint_fast32_t))
    {
        uint_fast32_t* End = ARRAYBEGIN(*p,uint_fast32_t)+Count;
        uint_fast32_t* i;
        uint_fast32_t* j;

        InQSort(ARRAYBEGIN(*p,uint_fast32_t), End-1, Cmp, CmpParam);

        j = ARRAYBEGIN(*p,uint_fast32_t);
        for (i=j+1; i!=End; ++i)
        {
            if (Cmp(CmpParam,i,j) < 0)
            {
                uint_fast32_t Tmp = *i;
                do
                {
                    j[1] = j[0];
                    if (j-- == ARRAYBEGIN(*p,uint_fast32_t))
                        break;
                }
                while (Cmp(CmpParam,&Tmp,j) < 0);
                j[1] = Tmp;
            }
            j = i;
        }

        if (Unique)
        {
            j = ARRAYBEGIN(*p,uint_fast32_t);
            for (i=j+1; i!=End; ++i)
            {
                if (Cmp(CmpParam,i,j) != 0)
                    *(++j) = *i;
            }
            p->_Used = ((j+1)-ARRAYBEGIN(*p,uint_fast32_t)) * sizeof(uint_fast32_t);
        }
        return;
    }

    SlowSort(p, Count, Width, Cmp, CmpParam, Unique);
}